

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool prvTidyParseConfigOption(TidyDocImpl *doc,ctmbstr optnam,ctmbstr optval)

{
  Bool BVar1;
  Bool BVar2;
  TidyOptionImpl *pTVar3;
  bool local_32;
  Bool local_30;
  Bool status;
  Bool isDeprecated;
  TidyOptionImpl *option;
  ctmbstr optval_local;
  ctmbstr optnam_local;
  TidyDocImpl *doc_local;
  
  pTVar3 = prvTidylookupOption(optnam);
  BVar1 = isOptionDeprecated(optnam);
  if (pTVar3 == (TidyOptionImpl *)0x0 || BVar1 != no) {
    local_30 = no;
    if (doc->pOptCallback != (TidyOptCallback)0x0) {
      local_30 = (*doc->pOptCallback)(optnam,optval);
    }
    if (doc->pConfigCallback != (TidyConfigCallback)0x0) {
      local_32 = true;
      if (local_30 == no) {
        BVar2 = (*doc->pConfigCallback)((TidyDoc)doc,optnam,optval);
        local_32 = BVar2 != no;
      }
      local_30 = (Bool)local_32;
    }
    if ((local_30 == no) && (BVar1 != no)) {
      local_30 = subDeprecatedOption(doc,optnam,optval);
    }
    if (local_30 == no) {
      prvTidyReportUnknownOption(doc,optnam);
    }
  }
  else {
    local_30 = prvTidyParseConfigValue(doc,pTVar3->id,optval);
  }
  return local_30;
}

Assistant:

Bool TY_(ParseConfigOption)( TidyDocImpl* doc, ctmbstr optnam, ctmbstr optval )
{
    const TidyOptionImpl* option = TY_(lookupOption)( optnam );
    Bool isDeprecated = isOptionDeprecated( optnam );
    Bool status = ( option != NULL ) && !isDeprecated;
    if ( !status )
    {
        /* Unknown or deprecated, so check to see if the user application
           wants to deal with it first. */
        if (NULL != doc->pOptCallback)
            status = (*doc->pOptCallback)( optnam, optval );
        if (NULL != doc->pConfigCallback )
            status = status || (*doc->pConfigCallback)( tidyImplToDoc(doc), optnam, optval );
        if (!status && isDeprecated)
            status = subDeprecatedOption( doc, optnam, optval);
        if (!status)
            TY_(ReportUnknownOption)( doc, optnam );
    }
    else
        status = TY_(ParseConfigValue)( doc, option->id, optval );

    return status;
}